

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_prepare_base_deletion_sync_finish(tsd_t *tsd,malloc_mutex_t **mutexes,uint n_mtx)

{
  malloc_mutex_t *pmVar1;
  ulong uVar2;
  
  for (uVar2 = 0; n_mtx != uVar2; uVar2 = uVar2 + 1) {
    malloc_mutex_lock((tsdn_t *)tsd,mutexes[uVar2]);
    pmVar1 = mutexes[uVar2];
    (pmVar1->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar1->field_0 + 0x48));
  }
  return;
}

Assistant:

static void
arena_prepare_base_deletion_sync_finish(tsd_t *tsd, malloc_mutex_t **mutexes,
    unsigned n_mtx) {
	for (unsigned i = 0; i < n_mtx; i++) {
		malloc_mutex_lock(tsd_tsdn(tsd), mutexes[i]);
		malloc_mutex_unlock(tsd_tsdn(tsd), mutexes[i]);
	}
}